

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test::TestBody
          (NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test *this)

{
  undefined1 local_570 [8];
  TestAllTypes dst;
  TestAllTypes src;
  NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test *this_local;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)((long)&dst.field_0 + 0x298));
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_570);
  proto2_nofieldpresence_unittest::TestAllTypes::operator=
            ((TestAllTypes *)local_570,(TestAllTypes *)((long)&dst.field_0 + 0x298));
  proto2_nofieldpresence_unittest::TestAllTypes::operator=
            ((TestAllTypes *)local_570,(TestAllTypes *)((long)&dst.field_0 + 0x298));
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_570);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            ((TestAllTypes *)((long)&dst.field_0 + 0x298));
  return;
}

Assistant:

TEST(NoFieldPresenceTest, CopyTwiceDefaultStringFieldTest) {
  // As an optimization, we maintain a default string in memory and messages
  // with uninitialized fields will be constructed with a pointer to this
  // default string object. The destructor should clear the field only when it
  // is "set" to a nondefault object.
  TestAllTypes src, dst;

  dst = src;
  dst = src;
}